

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

int secp256k1_ec_pubkey_sort(secp256k1_context *ctx,secp256k1_pubkey **pubkeys,size_t n_pubkeys)

{
  secp256k1_pubkey *psVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  secp256k1_pubkey **ppsVar5;
  ulong uVar6;
  
  if (pubkeys == (secp256k1_pubkey **)0x0) {
    secp256k1_ec_pubkey_sort_cold_1();
    iVar2 = 0;
  }
  else {
    if (1 < n_pubkeys) {
      uVar3 = n_pubkeys >> 1;
      do {
        uVar3 = uVar3 - 1;
        uVar4 = uVar3;
        while (uVar4 < n_pubkeys >> 1) {
          uVar6 = uVar4 * 2 + 2;
          if ((uVar6 < n_pubkeys) &&
             (iVar2 = secp256k1_ec_pubkey_cmp(ctx,pubkeys[uVar6],pubkeys[uVar4 * 2 + 1]), -1 < iVar2
             )) {
            ppsVar5 = pubkeys + uVar6;
            iVar2 = secp256k1_ec_pubkey_cmp(ctx,*ppsVar5,pubkeys[uVar4]);
            if (iVar2 < 1) break;
          }
          else {
            iVar2 = secp256k1_ec_pubkey_cmp(ctx,pubkeys[uVar4 * 2 + 1],pubkeys[uVar4]);
            if (iVar2 < 1) break;
            ppsVar5 = pubkeys + uVar4 * 2 + 1;
            uVar6 = uVar4 * 2 | 1;
          }
          psVar1 = pubkeys[uVar4];
          pubkeys[uVar4] = *ppsVar5;
          *ppsVar5 = psVar1;
          uVar4 = uVar6;
        }
      } while (uVar3 != 0);
    }
    iVar2 = 1;
    if (1 < n_pubkeys) {
      do {
        psVar1 = *pubkeys;
        *pubkeys = pubkeys[n_pubkeys - 1];
        pubkeys[n_pubkeys - 1] = psVar1;
        uVar3 = n_pubkeys - 1;
        if (n_pubkeys != 2) {
          uVar4 = 0;
          do {
            uVar6 = uVar4 * 2 + 2;
            if ((uVar6 < uVar3) &&
               (iVar2 = secp256k1_ec_pubkey_cmp(ctx,pubkeys[uVar6],pubkeys[uVar4 * 2 + 1]),
               -1 < iVar2)) {
              ppsVar5 = pubkeys + uVar6;
              iVar2 = secp256k1_ec_pubkey_cmp(ctx,*ppsVar5,pubkeys[uVar4]);
              if (iVar2 < 1) break;
            }
            else {
              iVar2 = secp256k1_ec_pubkey_cmp(ctx,pubkeys[uVar4 * 2 + 1],pubkeys[uVar4]);
              if (iVar2 < 1) break;
              ppsVar5 = pubkeys + uVar4 * 2 + 1;
              uVar6 = uVar4 * 2 | 1;
            }
            psVar1 = pubkeys[uVar4];
            pubkeys[uVar4] = *ppsVar5;
            *ppsVar5 = psVar1;
            uVar4 = uVar6;
          } while (uVar6 < uVar3 >> 1);
        }
        n_pubkeys = uVar3;
      } while (1 < uVar3);
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int secp256k1_ec_pubkey_sort(const secp256k1_context* ctx, const secp256k1_pubkey **pubkeys, size_t n_pubkeys) {
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkeys != NULL);

    /* Suppress wrong warning (fixed in MSVC 19.33) */
    #if defined(_MSC_VER) && (_MSC_VER < 1933)
    #pragma warning(push)
    #pragma warning(disable: 4090)
    #endif

    /* Casting away const is fine because neither secp256k1_hsort nor
     * secp256k1_ec_pubkey_sort_cmp modify the data pointed to by the cmp_data
     * argument. */
    secp256k1_hsort(pubkeys, n_pubkeys, sizeof(*pubkeys), secp256k1_ec_pubkey_sort_cmp, (void *)ctx);

    #if defined(_MSC_VER) && (_MSC_VER < 1933)
    #pragma warning(pop)
    #endif

    return 1;
}